

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcTranslateToC(char *fileName,char *mainName,_func_void_char_ptr *addDependency)

{
  bool bVar1;
  int iVar2;
  undefined1 local_48 [8];
  TraceScope traceScope;
  _func_void_char_ptr *addDependency_local;
  char *mainName_local;
  char *fileName_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    fileName_local._7_1_ = '\0';
  }
  else {
    if (nullcTranslateToC::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcTranslateToC::token);
      if (iVar2 != 0) {
        nullcTranslateToC::token = NULLC::TraceGetToken("nullc","nullcTranslateToC");
        __cxa_guard_release(&nullcTranslateToC::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_48,nullcTranslateToC::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      fileName_local._7_1_ = '\0';
    }
    else {
      bVar1 = TranslateToC(NULLC::compilerCtx,fileName,mainName,addDependency);
      if (bVar1) {
        fileName_local._7_1_ = '\x01';
      }
      else {
        NULLC::nullcLastError = NULLC::compilerCtx->errorBuf;
        fileName_local._7_1_ = '\0';
      }
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_48);
  }
  return fileName_local._7_1_;
}

Assistant:

nullres	nullcTranslateToC(const char *fileName, const char *mainName, void (*addDependency)(const char *fileName))
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcTranslateToC");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!TranslateToC(*compilerCtx, fileName, mainName, addDependency))
	{
		nullcLastError = compilerCtx->errorBuf;
		return 0;
	}

	return 1;
}